

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmimetype.cpp
# Opt level: O3

void QMimeType::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  qsizetype qVar6;
  Data *pDVar7;
  bool bVar8;
  QMimeDatabasePrivate *pQVar9;
  QArrayData *pQVar10;
  QString *pQVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    bVar8 = inherits((QMimeType *)_o,(QString *)_a[1]);
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar8;
    }
  }
  if ((_c != ReadProperty) || (0xc < (uint)_id)) goto LAB_004b3ed9;
  puVar1 = (undefined8 *)*_a;
  switch(_id) {
  case 0:
    *(bool *)puVar1 = _o->_vptr_QObject[3] != (_func_int *)0x0;
    break;
  case 1:
    bVar8 = isDefault((QMimeType *)_o);
    *(bool *)puVar1 = bVar8;
    break;
  case 2:
    pp_Var2 = _o->_vptr_QObject;
    p_Var3 = pp_Var2[1];
    p_Var4 = pp_Var2[2];
    p_Var5 = pp_Var2[3];
    if (p_Var3 != (_func_int *)0x0) {
      LOCK();
      *(int *)p_Var3 = *(int *)p_Var3 + 1;
      UNLOCK();
    }
    pQVar10 = (QArrayData *)*puVar1;
    *puVar1 = p_Var3;
    puVar1[1] = p_Var4;
    puVar1[2] = p_Var5;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QArrayData::deallocate(pQVar10,2,0x10);
          return;
        }
        goto LAB_004b3ef4;
      }
    }
    break;
  case 3:
    comment((QString *)&local_48,(QMimeType *)_o);
    goto LAB_004b3dd5;
  case 4:
    genericIconName((QString *)&local_48,(QMimeType *)_o);
    goto LAB_004b3ce4;
  case 5:
    iconName((QString *)&local_48,(QMimeType *)_o);
    goto LAB_004b3dd5;
  case 6:
    pQVar9 = QMimeDatabasePrivate::instance();
    QMimeDatabasePrivate::globPatterns
              ((QStringList *)&local_68,pQVar9,(QString *)(_o->_vptr_QObject + 1));
    goto LAB_004b3e40;
  case 7:
    pQVar9 = QMimeDatabasePrivate::instance();
    QMimeDatabasePrivate::mimeParents
              ((QStringList *)&local_68,pQVar9,(QString *)(_o->_vptr_QObject + 1));
    goto LAB_004b3e40;
  case 8:
    allAncestors((QStringList *)&local_68,(QMimeType *)_o);
    goto LAB_004b3e99;
  case 9:
    pQVar9 = QMimeDatabasePrivate::instance();
    QMimeDatabasePrivate::listAliases
              ((QStringList *)&local_68,pQVar9,(QString *)(_o->_vptr_QObject + 1));
LAB_004b3e40:
    qVar6 = local_68.size;
    pQVar11 = local_68.ptr;
    pDVar7 = local_68.d;
    local_68.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_48.d = (Data *)*puVar1;
    local_48.ptr = (QString *)puVar1[1];
    *puVar1 = pDVar7;
    puVar1[1] = pQVar11;
    local_48.size = puVar1[2];
    puVar1[2] = qVar6;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
LAB_004b3ed4:
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
    break;
  case 10:
    suffixes((QStringList *)&local_68,(QMimeType *)_o);
LAB_004b3e99:
    qVar6 = local_68.size;
    pQVar11 = local_68.ptr;
    pDVar7 = local_68.d;
    local_68.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_48.d = (Data *)*puVar1;
    local_48.ptr = (QString *)puVar1[1];
    *puVar1 = pDVar7;
    puVar1[1] = pQVar11;
    local_48.size = puVar1[2];
    puVar1[2] = qVar6;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    goto LAB_004b3ed4;
  case 0xb:
    preferredSuffix((QString *)&local_48,(QMimeType *)_o);
LAB_004b3dd5:
    pQVar10 = (QArrayData *)*puVar1;
    pQVar11 = (QString *)puVar1[1];
    *puVar1 = local_48.d;
    puVar1[1] = local_48.ptr;
LAB_004b3de7:
    qVar6 = puVar1[2];
    puVar1[2] = local_48.size;
    local_48.d = (Data *)pQVar10;
    local_48.ptr = pQVar11;
    local_48.size = qVar6;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
    break;
  case 0xc:
    filterString((QString *)&local_48,(QMimeType *)_o);
LAB_004b3ce4:
    pQVar10 = (QArrayData *)*puVar1;
    *puVar1 = local_48.d;
    pQVar11 = (QString *)puVar1[1];
    puVar1[1] = local_48.ptr;
    goto LAB_004b3de7;
  }
LAB_004b3ed9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_004b3ef4:
  __stack_chk_fail();
}

Assistant:

void QMimeType::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QMimeType *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { bool _r = _t->inherits((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isValid(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isDefault(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->name(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->comment(); break;
        case 4: *reinterpret_cast<QString*>(_v) = _t->genericIconName(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->iconName(); break;
        case 6: *reinterpret_cast<QStringList*>(_v) = _t->globPatterns(); break;
        case 7: *reinterpret_cast<QStringList*>(_v) = _t->parentMimeTypes(); break;
        case 8: *reinterpret_cast<QStringList*>(_v) = _t->allAncestors(); break;
        case 9: *reinterpret_cast<QStringList*>(_v) = _t->aliases(); break;
        case 10: *reinterpret_cast<QStringList*>(_v) = _t->suffixes(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->preferredSuffix(); break;
        case 12: *reinterpret_cast<QString*>(_v) = _t->filterString(); break;
        default: break;
        }
    }
}